

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_pointer_kernel_1.h
# Opt level: O3

void __thiscall dlib::bound_function_pointer::clear(bound_function_pointer *this)

{
  bound_function_pointer bStack_a8;
  
  bound_function_pointer(&bStack_a8);
  swap(&bStack_a8,this);
  (*(code *)**bStack_a8.bf_memory.data)();
  return;
}

Assistant:

void clear (
        ) { bound_function_pointer().swap(*this); }